

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O1

wchar_t archive_acl_parse_w(archive_acl *acl,wchar_t *text,wchar_t default_type)

{
  ulong uVar1;
  wchar_t *pwVar2;
  int iVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t *pwVar6;
  wchar_t *pwVar7;
  int *piVar8;
  wchar_t wVar9;
  ulong uVar10;
  wchar_t permset;
  anon_struct_16_2_267fbce2 field [4];
  wchar_t local_a4;
  undefined8 local_a0;
  wchar_t *local_98;
  wchar_t local_8c;
  wchar_t *local_88 [6];
  int *local_58;
  int *local_50;
  wchar_t *local_40;
  archive_acl *local_38;
  
  if ((text != (wchar_t *)0x0) && (*text != L'\0')) {
    local_38 = acl;
    local_8c = default_type;
    uVar1 = 0;
    do {
      do {
        while ((uVar10 = uVar1, pwVar6 = text, (ulong)(uint)*text < 0x21 &&
               ((0x100000600U >> ((ulong)(uint)*text & 0x3f) & 1) != 0))) {
          text = text + 1;
          uVar1 = uVar10;
        }
        while( true ) {
          wVar5 = *pwVar6;
          if (((ulong)(uint)wVar5 < 0x3b) &&
             (pwVar2 = pwVar6, (0x400100000000401U >> ((ulong)(uint)wVar5 & 0x3f) & 1) != 0)) break;
          pwVar6 = pwVar6 + 1;
        }
        do {
          pwVar7 = pwVar2;
          if (0x20 < (ulong)(uint)pwVar7[-1]) break;
          pwVar2 = pwVar7 + -1;
        } while ((0x100000600U >> ((ulong)(uint)pwVar7[-1] & 0x3f) & 1) != 0);
        wVar9 = *pwVar6;
        if (uVar10 < 4) {
          local_88[uVar10 * 2] = text;
          local_88[uVar10 * 2 + 1] = pwVar7;
        }
        text = pwVar6 + (wVar9 != L'\0');
        uVar1 = uVar10 + 1;
      } while (wVar5 == L':');
      if (uVar10 < 3) {
        memset(local_88 + uVar10 * 2 + 2,0,(uVar10 * -0x10 + 0x20 & 0xffffffff0) + 0x10);
      }
      pwVar2 = local_88[1];
      pwVar6 = local_88[0];
      local_98 = local_88[2];
      if (local_88[2] < local_88[3]) {
        wVar5 = L'\0';
        pwVar7 = local_88[2];
        do {
          wVar9 = *pwVar7;
          if ((uint)(wVar9 + L'\xffffffc6') < 0xfffffff6) goto LAB_00458b68;
          wVar4 = L'\x7fffffff';
          if ((wVar5 < L'\x0ccccccd') && ((wVar5 != L'\x0ccccccc' || (wVar9 < L'8')))) {
            wVar4 = wVar9 + wVar5 * 10 + L'\xffffffd0';
          }
          wVar5 = wVar4;
          pwVar7 = pwVar7 + 1;
        } while (pwVar7 < local_88[3]);
      }
      else {
LAB_00458b68:
        wVar5 = L'\xffffffff';
      }
      wVar9 = wVar5;
      if ((2 < uVar10 && wVar5 == L'\xffffffff') && (local_58 < local_50)) {
        wVar4 = L'\0';
        piVar8 = local_58;
        do {
          iVar3 = *piVar8;
          wVar9 = wVar5;
          if (iVar3 - 0x3aU < 0xfffffff6) break;
          wVar9 = L'\x7fffffff';
          if ((wVar4 < L'\x0ccccccd') && ((wVar4 != L'\x0ccccccc' || (iVar3 < 0x38)))) {
            wVar9 = iVar3 + wVar4 * 10 + L'\xffffffd0';
          }
          wVar4 = wVar9;
          piVar8 = piVar8 + 1;
          wVar9 = wVar4;
        } while (piVar8 < local_50);
      }
      pwVar7 = local_88[3];
      wVar5 = local_8c;
      local_a0 = uVar1;
      if (0x1c < (long)local_88[1] - (long)local_88[0]) {
        local_40 = local_88[3];
        iVar3 = wmemcmp(local_88[0],anon_var_dwarf_e1dc81,7);
        pwVar7 = local_40;
        wVar5 = local_8c;
        if (iVar3 == 0) {
          local_88[0] = pwVar6 + 7;
          wVar5 = L'Ȁ';
        }
      }
      if (local_88[0] == pwVar2) {
        return L'\xffffffec';
      }
      if (*local_88[0] == L'u') {
        pwVar6 = local_88[0] + 1;
        piVar8 = anon_var_dwarf_e1dc98;
        do {
          piVar8 = piVar8 + 1;
          if (pwVar2 <= pwVar6) break;
          wVar4 = *pwVar6;
          pwVar6 = pwVar6 + 1;
        } while (wVar4 == *piVar8);
        if (pwVar6 < pwVar2) goto LAB_00458c70;
        local_a0 = CONCAT44(local_a0._4_4_,wVar5);
        wVar5 = ismode_w(local_88[4],local_88[5],&local_a4);
        if (wVar5 == L'\0') {
          return L'\xffffffec';
        }
        if ((local_98 < pwVar7) || (wVar9 != L'\xffffffff')) {
          wVar4 = L'✑';
          pwVar6 = local_98;
        }
        else {
          wVar4 = L'✒';
LAB_00458f34:
          pwVar7 = (wchar_t *)0x0;
          pwVar6 = (wchar_t *)0x0;
        }
LAB_00458f3a:
        wVar5 = (wchar_t)local_a0;
      }
      else {
LAB_00458c70:
        if (local_88[0] == pwVar2) {
          return L'\xffffffec';
        }
        if (*local_88[0] == L'g') {
          pwVar6 = local_88[0] + 1;
          piVar8 = anon_var_dwarf_e1dcaf;
          do {
            piVar8 = piVar8 + 1;
            if (pwVar2 <= pwVar6) break;
            wVar4 = *pwVar6;
            pwVar6 = pwVar6 + 1;
          } while (wVar4 == *piVar8);
          if (pwVar2 <= pwVar6) {
            local_a0 = CONCAT44(local_a0._4_4_,wVar5);
            wVar5 = ismode_w(local_88[4],local_88[5],&local_a4);
            if (wVar5 == L'\0') {
              return L'\xffffffec';
            }
            if ((pwVar7 <= local_98) && (wVar9 == L'\xffffffff')) {
              wVar4 = L'✔';
              goto LAB_00458f34;
            }
            wVar4 = L'✓';
            pwVar6 = local_98;
            goto LAB_00458f3a;
          }
        }
        if (local_88[0] == pwVar2) {
          return L'\xffffffec';
        }
        iVar3 = (int)uVar10;
        if (*local_88[0] == L'o') {
          pwVar6 = local_88[0] + 1;
          piVar8 = anon_var_dwarf_e1dcc6;
          do {
            piVar8 = piVar8 + 1;
            if (pwVar2 <= pwVar6) break;
            wVar4 = *pwVar6;
            pwVar6 = pwVar6 + 1;
          } while (wVar4 == *piVar8);
          if (pwVar6 < pwVar2) goto LAB_00458ce0;
          if (iVar3 == 2) {
joined_r0x00458f06:
            if (local_98 != pwVar7) {
              return L'\xffffffec';
            }
            if (local_88[5] <= local_88[4]) {
              return L'\xffffffec';
            }
            local_a0._4_4_ = (undefined4)(local_a0 >> 0x20);
            local_a0 = CONCAT44(local_a0._4_4_,wVar5);
            wVar5 = ismode_w(local_88[4],local_88[5],&local_a4);
            if (wVar5 == L'\0') {
              return L'\xffffffec';
            }
            wVar4 = L'✖';
            goto LAB_00458f34;
          }
          if (iVar3 != 1) {
            return L'\xffffffec';
          }
          if ((pwVar7 <= local_98) || (wVar4 = ismode_w(local_98,pwVar7,&local_a4), wVar4 == L'\0'))
          {
            if (local_a0 != 3) {
              return L'\xffffffec';
            }
            local_a0 = 0;
            goto joined_r0x00458f06;
          }
          wVar4 = L'✖';
LAB_00458e7d:
          pwVar7 = (wchar_t *)0x0;
          pwVar6 = (wchar_t *)0x0;
        }
        else {
LAB_00458ce0:
          if (local_88[0] == pwVar2) {
            return L'\xffffffec';
          }
          if (*local_88[0] != L'm') {
            return L'\xffffffec';
          }
          pwVar6 = local_88[0] + 1;
          piVar8 = anon_var_dwarf_e1dcd1;
          do {
            piVar8 = piVar8 + 1;
            if (pwVar2 <= pwVar6) break;
            wVar4 = *pwVar6;
            pwVar6 = pwVar6 + 1;
          } while (wVar4 == *piVar8);
          if (pwVar6 < pwVar2) {
            return L'\xffffffec';
          }
          if (iVar3 != 2) {
            if (iVar3 != 1) {
              return L'\xffffffec';
            }
            if ((local_98 < pwVar7) && (wVar4 = ismode_w(local_98,pwVar7,&local_a4), wVar4 != L'\0')
               ) {
              wVar4 = L'✕';
              goto LAB_00458e7d;
            }
            if (local_a0 != 3) {
              return L'\xffffffec';
            }
            local_a0 = 3;
          }
          if ((local_98 != pwVar7) || (local_88[5] <= local_88[4])) {
            return L'\xffffffec';
          }
          wVar4 = ismode_w(local_88[4],local_88[5],&local_a4);
          if (wVar4 == L'\0') {
            return L'\xffffffec';
          }
          wVar4 = L'✕';
          pwVar7 = (wchar_t *)0x0;
          pwVar6 = (wchar_t *)0x0;
        }
      }
      archive_acl_add_entry_w_len
                (local_38,wVar5,local_a4,wVar4,wVar9,pwVar6,(long)pwVar7 - (long)pwVar6 >> 2);
      uVar1 = 0;
    } while (*text != L'\0');
  }
  return L'\0';
}

Assistant:

int
archive_acl_parse_w(struct archive_acl *acl,
    const wchar_t *text, int default_type)
{
	struct {
		const wchar_t *start;
		const wchar_t *end;
	} field[4], name;

	int fields, n;
	int type, tag, permset, id;
	wchar_t sep;

	while (text != NULL  &&  *text != L'\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const wchar_t *start, *end;
			next_field_w(&text, &start, &end, &sep);
			if (fields < 4) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == L':');

		/* Set remaining fields to blank. */
		for (n = fields; n < 4; ++n)
			field[n].start = field[n].end = NULL;

		/* Check for a numeric ID in field 1 or 3. */
		id = -1;
		isint_w(field[1].start, field[1].end, &id);
		/* Field 3 is optional. */
		if (id == -1 && fields > 3)
			isint_w(field[3].start, field[3].end, &id);

		/*
		 * Solaris extension:  "defaultuser::rwx" is the
		 * default ACL corresponding to "user::rwx", etc.
		 */
		if (field[0].end - field[0].start > 7
		    && wmemcmp(field[0].start, L"default", 7) == 0) {
			type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
			field[0].start += 7;
		} else
			type = default_type;

		name.start = name.end = NULL;
		if (prefix_w(field[0].start, field[0].end, L"user")) {
			if (!ismode_w(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_USER;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
		} else if (prefix_w(field[0].start, field[0].end, L"group")) {
			if (!ismode_w(field[2].start, field[2].end, &permset))
				return (ARCHIVE_WARN);
			if (id != -1 || field[1].start < field[1].end) {
				tag = ARCHIVE_ENTRY_ACL_GROUP;
				name = field[1];
			} else
				tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
		} else if (prefix_w(field[0].start, field[0].end, L"other")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode_w(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "other:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode_w(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "other::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_OTHER;
		} else if (prefix_w(field[0].start, field[0].end, L"mask")) {
			if (fields == 2
			    && field[1].start < field[1].end
			    && ismode_w(field[1].start, field[1].end, &permset)) {
				/* This is Solaris-style "mask:rwx" */
			} else if (fields == 3
			    && field[1].start == field[1].end
			    && field[2].start < field[2].end
			    && ismode_w(field[2].start, field[2].end, &permset)) {
				/* This is FreeBSD-style "mask::rwx" */
			} else
				return (ARCHIVE_WARN);
			tag = ARCHIVE_ENTRY_ACL_MASK;
		} else
			return (ARCHIVE_WARN);

		/* Add entry to the internal list. */
		archive_acl_add_entry_w_len(acl, type, permset,
		    tag, id, name.start, name.end - name.start);
	}
	return (ARCHIVE_OK);
}